

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_matcher.cpp
# Opt level: O1

idx_t duckdb::TemplatedMatch<false,duckdb::string_t,duckdb::LessThan>
                (Vector *param_1,TupleDataVectorFormat *lhs_format,SelectionVector *sel,idx_t count,
                TupleDataLayout *rhs_layout,Vector *rhs_row_locations,idx_t col_idx,
                vector<duckdb::MatchFunction,_true> *param_8,SelectionVector *no_match_sel,
                idx_t *no_match_count)

{
  undefined8 *puVar1;
  unsigned_long *puVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  value_type vVar6;
  sel_t *psVar7;
  const_reference pvVar8;
  idx_t iVar9;
  idx_t iVar10;
  idx_t iVar11;
  uchar **rhs_locations;
  idx_t entry_idx;
  bool bVar12;
  value_type rhs_offset_in_row;
  SelectionVector *lhs_sel;
  idx_t local_70;
  anon_union_16_2_67f50693_for_value local_40;
  
  puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.validity_mask;
  pSVar3 = (lhs_format->unified).sel;
  pdVar4 = (lhs_format->unified).data;
  pdVar5 = rhs_row_locations->data;
  pvVar8 = vector<unsigned_long,_true>::operator[](&rhs_layout->offsets,col_idx);
  vVar6 = *pvVar8;
  if (puVar2 == (unsigned_long *)0x0) {
    if (count != 0) {
      local_70 = 0;
      iVar9 = 0;
      do {
        iVar10 = iVar9;
        if (sel->sel_vector != (sel_t *)0x0) {
          iVar10 = (idx_t)sel->sel_vector[iVar9];
        }
        psVar7 = pSVar3->sel_vector;
        iVar11 = iVar10;
        if (psVar7 != (sel_t *)0x0) {
          iVar11 = (idx_t)psVar7[iVar10];
        }
        puVar1 = (undefined8 *)(*(long *)(pdVar5 + iVar10 * 8) + vVar6);
        local_40._0_8_ = *puVar1;
        local_40.pointer.ptr = (char *)puVar1[1];
        if (((1 << ((byte)col_idx & 7) &
             (uint)*(byte *)(*(long *)(pdVar5 + iVar10 * 8) + (col_idx >> 3))) != 0) &&
           (bVar12 = string_t::StringComparisonOperators::GreaterThan
                               ((string_t *)&local_40.pointer,(string_t *)(pdVar4 + iVar11 * 0x10)),
           bVar12)) {
          sel->sel_vector[local_70] = (sel_t)iVar10;
          local_70 = local_70 + 1;
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
      return local_70;
    }
  }
  else if (count != 0) {
    local_70 = 0;
    iVar9 = 0;
    do {
      iVar10 = iVar9;
      if (sel->sel_vector != (sel_t *)0x0) {
        iVar10 = (idx_t)sel->sel_vector[iVar9];
      }
      psVar7 = pSVar3->sel_vector;
      iVar11 = iVar10;
      if (psVar7 != (sel_t *)0x0) {
        iVar11 = (idx_t)psVar7[iVar10];
      }
      puVar2 = (lhs_format->unified).validity.super_TemplatedValidityMask<unsigned_long>.
               validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        bVar12 = false;
      }
      else {
        bVar12 = (puVar2[iVar11 >> 6] >> (iVar11 & 0x3f) & 1) == 0;
      }
      puVar1 = (undefined8 *)(*(long *)(pdVar5 + iVar10 * 8) + vVar6);
      local_40._0_8_ = *puVar1;
      local_40.pointer.ptr = (char *)puVar1[1];
      if (((!bVar12) &&
          (((uint)*(byte *)(*(long *)(pdVar5 + iVar10 * 8) + (col_idx >> 3)) &
           1 << ((byte)col_idx & 7)) != 0)) &&
         (bVar12 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)&local_40.pointer,(string_t *)(pdVar4 + iVar11 * 0x10)),
         bVar12)) {
        sel->sel_vector[local_70] = (sel_t)iVar10;
        local_70 = local_70 + 1;
      }
      iVar9 = iVar9 + 1;
    } while (count != iVar9);
    return local_70;
  }
  return 0;
}

Assistant:

static idx_t TemplatedMatch(Vector &, const TupleDataVectorFormat &lhs_format, SelectionVector &sel, const idx_t count,
                            const TupleDataLayout &rhs_layout, Vector &rhs_row_locations, const idx_t col_idx,
                            const vector<MatchFunction> &, SelectionVector *no_match_sel, idx_t &no_match_count) {
	if (lhs_format.unified.validity.AllValid()) {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, true>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                     col_idx, no_match_sel, no_match_count);
	} else {
		return TemplatedMatchLoop<NO_MATCH_SEL, T, OP, false>(lhs_format, sel, count, rhs_layout, rhs_row_locations,
		                                                      col_idx, no_match_sel, no_match_count);
	}
}